

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall
server_context::cancel_tasks
          (server_context *this,
          unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *id_tasks)

{
  bool bVar1;
  uint *puVar2;
  undefined8 in_RSI;
  server_task *in_RDI;
  server_task task;
  value_type_conflict *id_task;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *__range1;
  vector<server_task,_std::allocator<server_task>_> cancel_tasks;
  value_type *in_stack_fffffffffffff838;
  vector<server_task,_std::allocator<server_task>_> *in_stack_fffffffffffff850;
  size_type in_stack_fffffffffffff868;
  vector<server_task,_std::allocator<server_task>_> *in_stack_fffffffffffff870;
  undefined1 in_stack_fffffffffffff8a7;
  vector<server_task,_std::allocator<server_task>_> *in_stack_fffffffffffff8a8;
  server_queue *in_stack_fffffffffffff8b0;
  int in_stack_fffffffffffff8cc;
  server_response *in_stack_fffffffffffff8d0;
  _Node_iterator_base<int,_false> local_50;
  _Node_iterator_base<int,_false> local_48;
  undefined8 local_40;
  undefined8 local_10;
  
  local_10 = in_RSI;
  httplib::detail::std::vector<server_task,_std::allocator<server_task>_>::vector
            ((vector<server_task,_std::allocator<server_task>_> *)0x28acc6);
  httplib::detail::std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  ::size((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)0x28acd3);
  httplib::detail::std::vector<server_task,_std::allocator<server_task>_>::reserve
            (in_stack_fffffffffffff870,in_stack_fffffffffffff868);
  local_40 = local_10;
  local_48._M_cur =
       (__node_type *)
       httplib::detail::std::
       unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::begin
                 ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                  in_stack_fffffffffffff838);
  local_50._M_cur =
       (__node_type *)
       httplib::detail::std::
       unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::end
                 ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                  in_stack_fffffffffffff838);
  while( true ) {
    bVar1 = httplib::detail::std::__detail::operator!=(&local_48,&local_50);
    if (!bVar1) break;
    puVar2 = (uint *)httplib::detail::std::__detail::_Node_const_iterator<int,_true,_false>::
                     operator*((_Node_const_iterator<int,_true,_false> *)0x28ad47);
    if (-1 < common_log_verbosity_thold) {
      in_stack_fffffffffffff838 = (value_type *)common_log_main();
      common_log_add((common_log *)in_stack_fffffffffffff838,GGML_LOG_LEVEL_WARN,
                     "srv  %12.*s: cancel task, id_task = %d\n",0xc,"cancel_tasks",(ulong)*puVar2);
    }
    server_task::server_task(in_RDI,(server_task_type)((ulong)in_stack_fffffffffffff838 >> 0x20));
    server_response::remove_waiting_task_id(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8cc);
    httplib::detail::std::vector<server_task,_std::allocator<server_task>_>::push_back
              ((vector<server_task,_std::allocator<server_task>_> *)in_RDI,in_stack_fffffffffffff838
              );
    server_task::~server_task(in_RDI);
    httplib::detail::std::__detail::_Node_const_iterator<int,_true,_false>::operator++
              ((_Node_const_iterator<int,_true,_false> *)in_RDI);
  }
  server_queue::post(in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,
                     (bool)in_stack_fffffffffffff8a7);
  httplib::detail::std::vector<server_task,_std::allocator<server_task>_>::~vector
            (in_stack_fffffffffffff850);
  return;
}

Assistant:

void cancel_tasks(const std::unordered_set<int> & id_tasks) {
        std::vector<server_task> cancel_tasks;
        cancel_tasks.reserve(id_tasks.size());
        for (const auto & id_task : id_tasks) {
            SRV_WRN("cancel task, id_task = %d\n", id_task);

            server_task task(SERVER_TASK_TYPE_CANCEL);
            task.id_target = id_task;
            queue_results.remove_waiting_task_id(id_task);
            cancel_tasks.push_back(std::move(task));
        }
        // push to beginning of the queue, so it has highest priority
        queue_tasks.post(std::move(cancel_tasks), true);
    }